

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adam_benchmark.cpp
# Opt level: O1

void testModernIO(char *inFile,char *outFile,vector<char,_std::allocator<char>_> *inBuffer)

{
  pointer pcVar1;
  position_type pVar2;
  ulong uVar3;
  size_t bytesLeft;
  file in;
  file out;
  file_descriptor_handle fStack_78;
  file_descriptor_handle local_70;
  path local_68;
  char *local_40;
  char *local_38;
  
  local_40 = outFile;
  local_38 = inFile;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_68,&local_38,auto_format);
  io::posix::file::file((file *)&fStack_78,&local_68,read_only,owner_read|owner_write);
  std::filesystem::__cxx11::path::~path(&local_68);
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_68,&local_40,auto_format);
  io::posix::file::file((file *)&local_70,&local_68,create|write_only,owner_read|owner_write);
  std::filesystem::__cxx11::path::~path(&local_68);
  pVar2 = io::posix::file::seek((file *)&fStack_78,0,end);
  io::posix::file::seek((file *)&fStack_78,0,start);
  if (pVar2.pos_ != 0) {
    uVar3 = (long)(inBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(inBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    do {
      if ((ulong)pVar2.pos_ < uVar3) {
        uVar3 = pVar2.pos_;
      }
      local_68._M_pathname._M_dataplus._M_p =
           (inBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_68._M_pathname._M_string_length =
           (long)(inBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)local_68._M_pathname._M_dataplus._M_p;
      if (local_68._M_pathname._M_string_length == 0) {
        local_68._M_pathname._M_dataplus._M_p = (pointer)0x0;
      }
      if (uVar3 <= local_68._M_pathname._M_string_length) {
        local_68._M_pathname._M_string_length = uVar3;
      }
      io::net::read<io::posix::file,io::net::mutable_buffer,io::net::transfer_all>
                (&fStack_78,&local_68);
      pcVar1 = (inBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_68._M_pathname._M_string_length =
           (long)(inBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pcVar1;
      local_68._M_pathname._M_dataplus._M_p = (pointer)0x0;
      if (local_68._M_pathname._M_string_length != 0) {
        local_68._M_pathname._M_dataplus._M_p = pcVar1;
      }
      if (uVar3 <= local_68._M_pathname._M_string_length) {
        local_68._M_pathname._M_string_length = uVar3;
      }
      io::net::write<io::posix::file,io::net::mutable_buffer,io::net::transfer_all,void>
                (&local_70,&local_68);
      pVar2.pos_ = pVar2.pos_ - uVar3;
    } while (pVar2.pos_ != 0);
  }
  io::posix::file_descriptor_handle::~file_descriptor_handle(&local_70);
  io::posix::file_descriptor_handle::~file_descriptor_handle(&fStack_78);
  return;
}

Assistant:

void testModernIO(const char* inFile, const char* outFile, std::vector<char>& inBuffer)
{
    auto in = io::file{inFile, io::open_mode::read_only};
    auto out = io::file{outFile,
                        io::open_mode::write_only | io::open_mode::create};

    const auto inFileSize = io::seek(in, 0, io::seek_mode::end).offset_from_start();
    io::seek(in, 0, io::seek_mode::start);

    for (size_t bytesLeft = inFileSize, chunk = inBuffer.size(); bytesLeft > 0; bytesLeft -= chunk)
    {
        if (bytesLeft < chunk)
        {
            chunk = bytesLeft;
        }

        io::read(in, io::buffer(inBuffer, chunk));
        io::write(out, io::buffer(inBuffer, chunk));
    }
}